

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# norms.cpp
# Opt level: O2

void __thiscall
icu_63::Norms::reorder(Norms *this,UnicodeString *mapping,BuilderReorderingBuffer *buffer)

{
  int iVar1;
  short sVar2;
  uint8_t cc;
  int iVar3;
  char16_t *pcVar4;
  int iVar5;
  uint c;
  
  sVar2 = (mapping->fUnion).fStackFields.fLengthAndFlags;
  if (sVar2 < 0) {
    iVar5 = (mapping->fUnion).fFields.fLength;
  }
  else {
    iVar5 = (int)sVar2 >> 5;
  }
  pcVar4 = UnicodeString::getBuffer(mapping);
  iVar3 = 0;
  while (iVar3 < iVar5) {
    iVar1 = iVar3 + 1;
    c = (uint)(ushort)pcVar4[iVar3];
    if ((((c & 0xfc00) == 0xd800) && (iVar1 != iVar5)) &&
       (((ushort)pcVar4[iVar1] & 0xfc00) == 0xdc00)) {
      c = (uint)(ushort)pcVar4[iVar3] * 0x400 + (uint)(ushort)pcVar4[iVar1] + 0xfca02400;
      iVar1 = iVar3 + 2;
    }
    iVar3 = iVar1;
    cc = getCC(this,c);
    BuilderReorderingBuffer::append(buffer,c,cc);
  }
  if (buffer->fDidReorder != '\0') {
    BuilderReorderingBuffer::toString(buffer,mapping);
    return;
  }
  return;
}

Assistant:

void Norms::reorder(UnicodeString &mapping, BuilderReorderingBuffer &buffer) const {
    int32_t length=mapping.length();
    U_ASSERT(length<=Normalizer2Impl::MAPPING_LENGTH_MASK);
    const char16_t *s=mapping.getBuffer();
    int32_t i=0;
    UChar32 c;
    while(i<length) {
        U16_NEXT(s, i, length, c);
        buffer.append(c, getCC(c));
    }
    if(buffer.didReorder()) {
        buffer.toString(mapping);
    }
}